

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preferences.cpp
# Opt level: O3

void __thiscall f8n::prefs::Preferences::Save(Preferences *this)

{
  long *plVar1;
  FILE *__s;
  runtime_error *this_00;
  long *plVar2;
  bool in_DL;
  long *local_e8;
  long local_d8;
  long lStack_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  string_t local_88;
  string local_68;
  char *local_48;
  undefined8 local_40;
  undefined2 local_38;
  undefined1 uStack_36;
  undefined5 uStack_35;
  
  if (this->mode != ModeTransient) {
    if (this->mode == ModeReadOnly) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"cannot save a ModeReadOnly Preference!");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    env::GetDataDirectory_abi_cxx11_(&local_68,(env *)0x1,in_DL);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_68);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_b8 = *plVar2;
      lStack_b0 = plVar1[3];
      local_c8 = &local_b8;
    }
    else {
      local_b8 = *plVar2;
      local_c8 = (long *)*plVar1;
    }
    local_c0 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_c8,(ulong)(this->component)._M_dataplus._M_p);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_98 = *plVar2;
      lStack_90 = plVar1[3];
      local_a8 = &local_98;
    }
    else {
      local_98 = *plVar2;
      local_a8 = (long *)*plVar1;
    }
    local_a0 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_a8);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_d8 = *plVar2;
      lStack_d0 = plVar1[3];
      local_e8 = &local_d8;
    }
    else {
      local_d8 = *plVar2;
      local_e8 = (long *)*plVar1;
    }
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::dump(&local_88,&this->json,2,' ',false,strict);
    local_38 = 0x6277;
    local_40 = 2;
    uStack_36 = 0;
    local_48 = (char *)&local_38;
    __s = fopen((char *)local_e8,(char *)&local_38);
    if (local_48 != (char *)&local_38) {
      operator_delete(local_48,CONCAT53(uStack_35,CONCAT12(uStack_36,local_38)) + 1);
    }
    if (__s != (FILE *)0x0) {
      fwrite(local_88._M_dataplus._M_p,local_88._M_string_length,1,__s);
      fclose(__s);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8,local_98 + 1);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,local_b8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void Preferences::Save() {
    if (this->mode == ModeReadOnly) {
        throw std::runtime_error("cannot save a ModeReadOnly Preference!");
    }
    else if (this->mode != ModeTransient) {
        stringToFile(FILENAME(this->component), this->json.dump(2));
    }
}